

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O1

int sprintf_s(char *buffer,size_t sizeOfBuffer,char *format,...)

{
  char in_AL;
  uint uVar1;
  uint uVar2;
  int *piVar3;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  va_list ap;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (buffer == (char *)0x0 || format == (char *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    uVar2 = 0xffffffff;
  }
  else {
    ap[0].overflow_arg_area = local_d8;
    ap[0]._0_8_ = &stack0x00000008;
    local_28 = 0x3000000018;
    uVar1 = vsnprintf(buffer,sizeOfBuffer,format,&local_28);
    uVar2 = 0xffffffff;
    if (uVar1 < sizeOfBuffer) {
      uVar2 = uVar1;
    }
    if ((int)uVar1 < 0) {
      uVar2 = 0xffffffff;
    }
  }
  return uVar2;
}

Assistant:

int sprintf_s( char *buffer, size_t sizeOfBuffer, const char *format, ... )
{
    int retval;
    va_list ap;

	if( buffer == nullptr || format == nullptr)
	{
		errno = EINVAL;
		return -1;
	}

    va_start(ap, format);
    retval = vsnprintf(buffer, sizeOfBuffer, format, ap);
    va_end(ap);

	if( retval < 0 || static_cast<size_t>(retval) >= sizeOfBuffer )
		retval = -1;

    return retval;
}